

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O1

void __thiscall
Assimp::Discreet3DSImporter::ApplyMasterScale(Discreet3DSImporter *this,aiScene *pScene)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  aiNode *paVar17;
  float fVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  
  uVar19 = -(uint)(this->mMasterScale != 0.0);
  fVar18 = (float)(~uVar19 & 0x3f800000 | (uint)(1.0 / this->mMasterScale) & uVar19);
  this->mMasterScale = fVar18;
  paVar17 = pScene->mRootNode;
  fVar1 = (paVar17->mTransformation).a1;
  fVar2 = (paVar17->mTransformation).a2;
  fVar28 = fVar2 * 0.0;
  fVar3 = (paVar17->mTransformation).a3;
  fVar20 = fVar3 * 0.0;
  fVar4 = (paVar17->mTransformation).a4;
  fVar26 = fVar1 * 0.0;
  fVar27 = fVar26 + fVar28;
  fVar31 = fVar4 * 0.0;
  fVar5 = (paVar17->mTransformation).b1;
  fVar6 = (paVar17->mTransformation).b2;
  fVar32 = fVar6 * 0.0;
  fVar7 = (paVar17->mTransformation).b3;
  fVar21 = fVar7 * 0.0;
  fVar8 = (paVar17->mTransformation).b4;
  fVar29 = fVar5 * 0.0;
  fVar30 = fVar29 + fVar32;
  fVar35 = fVar8 * 0.0;
  fVar9 = (paVar17->mTransformation).c1;
  fVar10 = (paVar17->mTransformation).c2;
  fVar36 = fVar10 * 0.0;
  fVar11 = (paVar17->mTransformation).c3;
  fVar22 = fVar11 * 0.0;
  fVar33 = fVar9 * 0.0;
  fVar34 = fVar33 + fVar36;
  fVar12 = (paVar17->mTransformation).c4;
  fVar37 = fVar12 * 0.0;
  fVar13 = (paVar17->mTransformation).d2;
  fVar23 = fVar13 * 0.0;
  fVar14 = (paVar17->mTransformation).d1;
  fVar38 = fVar14 * 0.0;
  fVar39 = fVar38 + fVar23;
  fVar15 = (paVar17->mTransformation).d3;
  fVar24 = fVar15 * 0.0;
  fVar16 = (paVar17->mTransformation).d4;
  fVar25 = fVar16 * 0.0;
  (paVar17->mTransformation).a1 = fVar18 * fVar1 + fVar28 + fVar20 + fVar31;
  (paVar17->mTransformation).a2 = fVar2 * fVar18 + fVar26 + fVar20 + fVar31;
  (paVar17->mTransformation).a3 = fVar3 * fVar18 + fVar27 + fVar31;
  (paVar17->mTransformation).a4 = fVar27 + fVar20 + fVar4;
  (paVar17->mTransformation).b1 = fVar18 * fVar5 + fVar32 + fVar21 + fVar35;
  (paVar17->mTransformation).b2 = fVar6 * fVar18 + fVar29 + fVar21 + fVar35;
  (paVar17->mTransformation).b3 = fVar7 * fVar18 + fVar30 + fVar35;
  (paVar17->mTransformation).b4 = fVar30 + fVar21 + fVar8;
  (paVar17->mTransformation).c1 = fVar18 * fVar9 + fVar36 + fVar22 + fVar37;
  (paVar17->mTransformation).c2 = fVar10 * fVar18 + fVar33 + fVar22 + fVar37;
  (paVar17->mTransformation).c3 = fVar11 * fVar18 + fVar34 + fVar37;
  (paVar17->mTransformation).c4 = fVar34 + fVar22 + fVar12;
  (paVar17->mTransformation).d1 = fVar18 * fVar14 + fVar23 + fVar24 + fVar25;
  (paVar17->mTransformation).d2 = fVar13 * fVar18 + fVar38 + fVar24 + fVar25;
  (paVar17->mTransformation).d3 = fVar18 * fVar15 + fVar39 + fVar25;
  (paVar17->mTransformation).d4 = fVar39 + fVar24 + fVar16;
  return;
}

Assistant:

void Discreet3DSImporter::ApplyMasterScale(aiScene* pScene)
{
    // There are some 3DS files with a zero scaling factor
    if (!mMasterScale)mMasterScale = 1.0f;
    else mMasterScale = 1.0f / mMasterScale;

    // Construct an uniform scaling matrix and multiply with it
    pScene->mRootNode->mTransformation *= aiMatrix4x4(
        mMasterScale,0.0f, 0.0f, 0.0f,
        0.0f, mMasterScale,0.0f, 0.0f,
        0.0f, 0.0f, mMasterScale,0.0f,
        0.0f, 0.0f, 0.0f, 1.0f);

    // Check whether a scaling track is assigned to the root node.
}